

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O3

void PVG_FT_Stroker_ExportBorder
               (PVG_FT_Stroker stroker,PVG_FT_StrokerBorder border,PVG_FT_Outline *outline)

{
  byte bVar1;
  PVG_FT_Byte *pPVar2;
  char *pcVar3;
  int iVar4;
  PVG_FT_Error PVar5;
  PVG_FT_UInt PVar6;
  long lVar7;
  int *piVar8;
  byte bVar9;
  PVG_FT_StrokeBorderRec *pPVar10;
  
  if (PVG_FT_STROKER_BORDER_RIGHT < border) {
    return;
  }
  if (stroker->borders[border].valid == '\0') {
    return;
  }
  pPVar10 = stroker->borders + border;
  memcpy(outline->points + outline->n_points,stroker->borders[border].points,
         (ulong)pPVar10->num_points << 4);
  PVar6 = pPVar10->num_points;
  iVar4 = outline->n_points;
  if (PVar6 != 0) {
    pPVar2 = stroker->borders[border].tags;
    pcVar3 = outline->tags;
    lVar7 = 0;
    do {
      bVar1 = pPVar2[lVar7];
      bVar9 = bVar1 & 2;
      if ((bVar1 & 1) != 0) {
        bVar9 = 1;
      }
      pcVar3[lVar7 + iVar4] = bVar9;
      lVar7 = lVar7 + 1;
    } while (PVar6 != (PVG_FT_UInt)lVar7);
    PVar6 = pPVar10->num_points;
    iVar4 = outline->n_points;
    if (PVar6 != 0) {
      pPVar2 = stroker->borders[border].tags;
      piVar8 = outline->contours + outline->n_contours;
      lVar7 = 0;
      do {
        if ((pPVar2[lVar7] & 8) != 0) {
          *piVar8 = iVar4 + (int)lVar7;
          piVar8 = piVar8 + 1;
          outline->n_contours = outline->n_contours + 1;
        }
        lVar7 = lVar7 + 1;
      } while (PVar6 != (PVG_FT_UInt)lVar7);
      iVar4 = outline->n_points;
      PVar6 = pPVar10->num_points;
      goto LAB_0013e34d;
    }
  }
  PVar6 = 0;
LAB_0013e34d:
  outline->n_points = PVar6 + iVar4;
  PVar5 = PVG_FT_Outline_Check(outline);
  if (PVar5 == 0) {
    return;
  }
  __assert_fail("PVG_FT_Outline_Check(outline) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-ft-stroker.c"
                ,0x255,"void ft_stroke_border_export(PVG_FT_StrokeBorder, PVG_FT_Outline *)");
}

Assistant:

void PVG_FT_Stroker_ExportBorder(PVG_FT_Stroker       stroker,
                                PVG_FT_StrokerBorder border,
                                PVG_FT_Outline*      outline)
{
    if (border == PVG_FT_STROKER_BORDER_LEFT ||
        border == PVG_FT_STROKER_BORDER_RIGHT) {
        PVG_FT_StrokeBorder sborder = &stroker->borders[border];

        if (sborder->valid) ft_stroke_border_export(sborder, outline);
    }
}